

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodictable.cpp
# Opt level: O3

void __thiscall
indigox::Element::Element
          (Element *this,uint8_t Z,string *name,string *symbol,float mass,uint8_t group,
          uint8_t period,uint8_t valence,uint8_t octet,uint8_t hyperOctet,float atomicR,float covR,
          float vdwR,float chi)

{
  pointer pcVar1;
  
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + name->_M_string_length);
  (this->symbol_)._M_dataplus._M_p = (pointer)&(this->symbol_).field_2;
  pcVar1 = (symbol->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->symbol_,pcVar1,pcVar1 + symbol->_M_string_length);
  this->grp_ = group;
  this->period_ = period;
  this->Z_ = Z;
  this->val_ = valence;
  this->oct_ = octet;
  this->hyper_ = hyperOctet;
  this->mass_ = mass;
  this->radius_ = atomicR;
  this->cov_ = covR;
  this->vdw_ = vdwR;
  this->chi_ = chi;
  return;
}

Assistant:

Element::Element(uint8_t Z, std::string name, std::string symbol, float mass,
                   uint8_t group, uint8_t period, uint8_t valence,
                   uint8_t octet, uint8_t hyperOctet, float atomicR, float covR,
                   float vdwR, float chi)
  : name_(name), symbol_(symbol), grp_(group), period_(period),Z_(Z),
  val_(valence), oct_(octet), hyper_(hyperOctet), mass_(mass), radius_(atomicR),
  cov_(covR), vdw_(vdwR), chi_(chi) { }